

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void unicodeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  u32 uVar1;
  long in_FS_OFFSET;
  uchar *z;
  uchar *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (uchar *)sqlite3ValueText(*argv,'\x01');
  if ((local_18 != (uchar *)0x0) && (*local_18 != '\0')) {
    uVar1 = sqlite3Utf8Read(&local_18);
    pMem = context->pOut;
    if ((pMem->flags & 0x9000) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        vdbeReleaseAndSetInt64(pMem,(long)(int)uVar1);
        return;
      }
      goto LAB_001aefff;
    }
    (pMem->u).i = (long)(int)uVar1;
    pMem->flags = 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_001aefff:
  __stack_chk_fail();
}

Assistant:

static void unicodeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z = sqlite3_value_text(argv[0]);
  (void)argc;
  if( z && z[0] ) sqlite3_result_int(context, sqlite3Utf8Read(&z));
}